

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSliderConstraint.h
# Opt level: O0

char * __thiscall
btSliderConstraint::serialize(btSliderConstraint *this,void *dataBuffer,btSerializer *serializer)

{
  btTransform *in_RSI;
  btTransformFloatData *in_RDI;
  btSerializer *unaff_retaddr;
  btSliderConstraintData *sliderData;
  
  btTypedConstraint::serialize((btTypedConstraint *)serializer,sliderData,unaff_retaddr);
  btTransform::serialize(in_RSI,in_RDI);
  btTransform::serialize(in_RSI,in_RDI);
  in_RSI[3].m_basis.m_el[0].m_floats[0] = in_RDI[3].m_basis.m_el[1].m_floats[1];
  in_RSI[3].m_basis.m_el[0].m_floats[1] = in_RDI[3].m_basis.m_el[1].m_floats[0];
  in_RSI[3].m_basis.m_el[0].m_floats[2] = in_RDI[3].m_basis.m_el[1].m_floats[3];
  in_RSI[3].m_basis.m_el[0].m_floats[3] = in_RDI[3].m_basis.m_el[1].m_floats[2];
  in_RSI[3].m_basis.m_el[1].m_floats[0] =
       (btScalar)(uint)(*(byte *)(in_RDI[3].m_basis.m_el[0].m_floats + 3) & 1);
  in_RSI[3].m_basis.m_el[1].m_floats[1] =
       (btScalar)(uint)(*(byte *)((long)in_RDI[1].m_basis.m_el[0].m_floats + 9) & 1);
  return "btSliderConstraintData";
}

Assistant:

SIMD_FORCE_INLINE	const char*	btSliderConstraint::serialize(void* dataBuffer, btSerializer* serializer) const
{

	btSliderConstraintData2* sliderData = (btSliderConstraintData2*) dataBuffer;
	btTypedConstraint::serialize(&sliderData->m_typeConstraintData,serializer);

	m_frameInA.serialize(sliderData->m_rbAFrame);
	m_frameInB.serialize(sliderData->m_rbBFrame);

	sliderData->m_linearUpperLimit = m_upperLinLimit;
	sliderData->m_linearLowerLimit = m_lowerLinLimit;

	sliderData->m_angularUpperLimit = m_upperAngLimit;
	sliderData->m_angularLowerLimit = m_lowerAngLimit;

	sliderData->m_useLinearReferenceFrameA = m_useLinearReferenceFrameA;
	sliderData->m_useOffsetForConstraintFrame = m_useOffsetForConstraintFrame;

	return btSliderConstraintDataName;
}